

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddLocalMaxPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt)

{
  TEdge *e2_00;
  
  AddOutPt(this,e1,pt);
  if (e1->outIdx != e2->outIdx) {
    e2_00 = e1;
    if (e1->outIdx < e2->outIdx) {
      e2_00 = e2;
      e2 = e1;
    }
    AppendPolygon(this,e2,e2_00);
    return;
  }
  e1->outIdx = -1;
  e2->outIdx = -1;
  return;
}

Assistant:

void Clipper::AddLocalMaxPoly(TEdge *e1, TEdge *e2, const IntPoint &pt)
{
  AddOutPt( e1, pt );
  if( e1->outIdx == e2->outIdx )
  {
    e1->outIdx = -1;
    e2->outIdx = -1;
  }
  else if (e1->outIdx < e2->outIdx) 
    AppendPolygon(e1, e2); 
  else 
    AppendPolygon(e2, e1);
}